

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O2

void __thiscall duckdb::Appender::AddColumn(Appender *this,string *name)

{
  vector<duckdb::LogicalType,_true> *this_00;
  pointer pLVar1;
  idx_t *piVar2;
  _Alloc_hider __p;
  bool bVar3;
  pointer pTVar4;
  reference this_01;
  string *__lhs;
  LogicalIndex LVar5;
  InvalidInputException *pIVar6;
  LogicalType *__x;
  vector<duckdb::LogicalType,_true> *args_1;
  ulong __n;
  pointer pLVar7;
  allocator local_59;
  string local_58;
  vector<duckdb::LogicalIndex,_true> *local_38;
  
  BaseAppender::Flush(&this->super_BaseAppender);
  local_38 = &this->column_ids;
  __n = 0;
  do {
    pTVar4 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             ::operator->(&this->description);
    if ((ulong)(((long)(pTVar4->columns).
                       super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                       .
                       super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                (long)(pTVar4->columns).
                      super_vector<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      .
                      super__Vector_base<duckdb::ColumnDefinition,_std::allocator<duckdb::ColumnDefinition>_>
                      ._M_impl.super__Vector_impl_data._M_start) / 0xd8) <= __n) {
      pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
      ::std::__cxx11::string::string
                ((string *)&local_58,"the column must exist in the table",&local_59);
      InvalidInputException::InvalidInputException(pIVar6,&local_58);
      __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
    }
    pTVar4 = unique_ptr<duckdb::TableDescription,_std::default_delete<duckdb::TableDescription>,_true>
             ::operator->(&this->description);
    this_01 = vector<duckdb::ColumnDefinition,_true>::get<true>(&pTVar4->columns,__n);
    __lhs = ColumnDefinition::Name_abi_cxx11_(this_01);
    bVar3 = ::std::operator!=(__lhs,name);
    __n = __n + 1;
  } while (bVar3);
  bVar3 = ColumnDefinition::Generated(this_01);
  if (!bVar3) {
    pLVar1 = (this->column_ids).
             super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pLVar7 = (this->column_ids).
             super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>.
             super__Vector_base<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>._M_impl
             .super__Vector_impl_data._M_start;
    do {
      if (pLVar7 == pLVar1) {
        this_00 = &(this->super_BaseAppender).active_types;
        __x = ColumnDefinition::Type(this_01);
        ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::push_back
                  (&this_00->super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>
                   ,__x);
        local_58._M_dataplus._M_p = (pointer)ColumnDefinition::Logical(this_01);
        ::std::vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>::
        emplace_back<duckdb::LogicalIndex>
                  (&local_38->
                    super_vector<duckdb::LogicalIndex,_std::allocator<duckdb::LogicalIndex>_>,
                   (LogicalIndex *)&local_58);
        BaseAppender::InitializeChunk(&this->super_BaseAppender);
        args_1 = &(this->super_BaseAppender).types;
        if ((this->super_BaseAppender).active_types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_start !=
            (this->super_BaseAppender).active_types.
            super_vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>.
            super__Vector_base<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>._M_impl.
            super__Vector_impl_data._M_finish) {
          args_1 = this_00;
        }
        make_uniq<duckdb::ColumnDataCollection,duckdb::Allocator&,duckdb::vector<duckdb::LogicalType,true>const&>
                  ((duckdb *)&local_58,(this->super_BaseAppender).allocator,args_1);
        __p._M_p = local_58._M_dataplus._M_p;
        local_58._M_dataplus._M_p = (pointer)0x0;
        ::std::
        __uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::reset((__uniq_ptr_impl<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                 *)&(this->super_BaseAppender).collection,(pointer)__p._M_p);
        ::std::
        unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
        ::~unique_ptr((unique_ptr<duckdb::ColumnDataCollection,_std::default_delete<duckdb::ColumnDataCollection>_>
                       *)&local_58);
        return;
      }
      LVar5 = ColumnDefinition::Logical(this_01);
      piVar2 = &pLVar7->index;
      pLVar7 = pLVar7 + 1;
    } while (*piVar2 != LVar5.index);
    pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
    ::std::__cxx11::string::string((string *)&local_58,"cannot add the same column twice",&local_59)
    ;
    InvalidInputException::InvalidInputException(pIVar6,&local_58);
    __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
  }
  pIVar6 = (InvalidInputException *)__cxa_allocate_exception(0x10);
  ::std::__cxx11::string::string
            ((string *)&local_58,"cannot add a generated column to the appender",&local_59);
  InvalidInputException::InvalidInputException(pIVar6,&local_58);
  __cxa_throw(pIVar6,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void Appender::AddColumn(const string &name) {
	Flush();

	auto exists = false;
	for (idx_t col_idx = 0; col_idx < description->columns.size(); col_idx++) {
		auto &col_def = description->columns[col_idx];
		if (col_def.Name() != name) {
			continue;
		}

		// Ensure that we are not adding a generated column.
		if (col_def.Generated()) {
			throw InvalidInputException("cannot add a generated column to the appender");
		}

		// Ensure that we haven't added this column before.
		for (const auto &column_id : column_ids) {
			if (column_id == col_def.Logical()) {
				throw InvalidInputException("cannot add the same column twice");
			}
		}

		active_types.push_back(col_def.Type());
		column_ids.push_back(col_def.Logical());
		exists = true;
		break;
	}
	if (!exists) {
		throw InvalidInputException("the column must exist in the table");
	}

	InitializeChunk();
	collection = make_uniq<ColumnDataCollection>(allocator, GetActiveTypes());
}